

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

int message_get_header(MESSAGE_HANDLE message,HEADER_HANDLE *header)

{
  LOGGER_LOG p_Var1;
  HEADER_HANDLE pHVar2;
  int iVar3;
  
  if (message == (MESSAGE_HANDLE)0x0 || header == (HEADER_HANDLE *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x1df;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                ,"message_get_header",0x1de,1,"Bad arguments: message = %p, header = %p",message,
                header);
    }
  }
  else if (message->header == (HEADER_HANDLE)0x0) {
    *header = (HEADER_HANDLE)0x0;
    iVar3 = 0;
  }
  else {
    pHVar2 = header_clone(message->header);
    *header = pHVar2;
    iVar3 = 0;
    if (pHVar2 == (HEADER_HANDLE)0x0) {
      p_Var1 = xlogging_get_log_function();
      iVar3 = 500;
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                  ,"message_get_header",499,1,"Cannot clone message header");
      }
    }
  }
  return iVar3;
}

Assistant:

int message_get_header(MESSAGE_HANDLE message, HEADER_HANDLE* header)
{
    int result;

    if ((message == NULL) ||
        (header == NULL))
    {
        /* Codes_SRS_MESSAGE_01_029: [ If `message` or `message_header` is NULL, `message_get_header` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, header = %p",
            message, header);
        result = MU_FAILURE;
    }
    else
    {
        if (message->header == NULL)
        {
            /* Codes_SRS_MESSAGE_01_143: [ If no header has been set, `message_get_header` shall set `message_header` to NULL. ]*/
            *header = NULL;

            /* Codes_SRS_MESSAGE_01_028: [ On success, `message_get_header` shall return 0.]*/
            result = 0;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_027: [ `message_get_header` shall copy the contents of header for the message instance identified by `message` into the argument `message_header`. ]*/
            /* Codes_SRS_MESSAGE_01_030: [ Cloning the header shall be done by calling `header_clone`. ]*/
            *header = header_clone(message->header);
            if (*header == NULL)
            {
                /* Codes_SRS_MESSAGE_01_031: [ If `header_clone` fails, `message_get_header` shall fail and return a non-zero value. ]*/
                LogError("Cannot clone message header");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_028: [ On success, `message_get_header` shall return 0.]*/
                result = 0;
            }
        }
    }

    return result;
}